

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

void __thiscall
gtl::internal_btree::
btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
::split(btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
        *this,int insert_position,
       btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
       *dest,allocator_type *alloc)

{
  uint i;
  btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
  bVar1;
  btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
  *pbVar2;
  int iVar3;
  slot_type<S2BooleanOperation::SourceId,_int> *local_28;
  
  if (((ulong)dest & 7) == 0) {
    if (dest[10] !=
        (btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
         )0x0) {
      __assert_fail("dest->count() == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                    ,0x675,
                    "void gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId, int, std::less<S2BooleanOperation::SourceId>, std::allocator<std::pair<const S2BooleanOperation::SourceId, int>>, 256, false>>::split(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::map_params<S2BooleanOperation::SourceId, int, std::less<S2BooleanOperation::SourceId>, std::allocator<std::pair<const S2BooleanOperation::SourceId, int>>, 256, false>]"
                   );
    }
    if (((ulong)this & 7) == 0) {
      if ((this[0xb] !=
           (btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
            )0x0) &&
         (this[0xb] !=
          (btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
           )0x14)) {
        __assert_fail("max_count() == kNodeValues",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                      ,0x676,
                      "void gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId, int, std::less<S2BooleanOperation::SourceId>, std::allocator<std::pair<const S2BooleanOperation::SourceId, int>>, 256, false>>::split(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::map_params<S2BooleanOperation::SourceId, int, std::less<S2BooleanOperation::SourceId>, std::allocator<std::pair<const S2BooleanOperation::SourceId, int>>, 256, false>]"
                     );
      }
      if (insert_position == 0x14) {
        bVar1 = (btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
                 )0x0;
      }
      else if (insert_position == 0) {
        bVar1 = (btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
                 )((char)this[10] - 1);
      }
      else {
        bVar1 = (btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
                 )((byte)this[10] >> 1);
      }
      dest[10] = bVar1;
      bVar1 = (btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
               )((char)this[10] - (char)bVar1);
      this[10] = bVar1;
      if (bVar1 != (btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
                    )0x0) {
        uninitialized_move_n(this,(ulong)(byte)dest[10],(ulong)(byte)bVar1,0,dest,alloc);
        bVar1 = this[10];
        this[10] = (btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
                    )((char)bVar1 - 1U);
        local_28 = (slot_type<S2BooleanOperation::SourceId,_int> *)
                   (this + (ulong)(byte)((char)bVar1 - 1U) * 0xc + 0xc);
        btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,int,std::less<S2BooleanOperation::SourceId>,std::allocator<std::pair<S2BooleanOperation::SourceId_const,int>>,256,false>>
        ::emplace_value<absl::container_internal::slot_type<S2BooleanOperation::SourceId,int>*>
                  (*(btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,int,std::less<S2BooleanOperation::SourceId>,std::allocator<std::pair<S2BooleanOperation::SourceId_const,int>>,256,false>>
                     **)this,(ulong)(byte)this[8],alloc,&local_28);
        init_child(*(btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
                     **)this,(byte)this[8] + 1,dest);
        if (this[0xb] ==
            (btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
             )0x0) {
          iVar3 = 1;
          do {
            pbVar2 = child(this,(uint)(byte)this[10] + iVar3);
            if (pbVar2 == (btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
                           *)0x0) {
              __assert_fail("child(count() + i + 1) != nullptr",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                            ,0x694,
                            "void gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId, int, std::less<S2BooleanOperation::SourceId>, std::allocator<std::pair<const S2BooleanOperation::SourceId, int>>, 256, false>>::split(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::map_params<S2BooleanOperation::SourceId, int, std::less<S2BooleanOperation::SourceId>, std::allocator<std::pair<const S2BooleanOperation::SourceId, int>>, 256, false>]"
                           );
            }
            i = iVar3 - 1;
            pbVar2 = child(this,(uint)(byte)this[10] + iVar3);
            init_child(dest,i,pbVar2);
            mutable_child(this,(uint)(byte)this[10] + iVar3);
            iVar3 = iVar3 + 1;
          } while (i < (byte)dest[10]);
        }
        return;
      }
      __assert_fail("count() >= 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                    ,0x684,
                    "void gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId, int, std::less<S2BooleanOperation::SourceId>, std::allocator<std::pair<const S2BooleanOperation::SourceId, int>>, 256, false>>::split(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::map_params<S2BooleanOperation::SourceId, int, std::less<S2BooleanOperation::SourceId>, std::allocator<std::pair<const S2BooleanOperation::SourceId, int>>, 256, false>]"
                   );
    }
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/internal/layout.h"
                ,0x1e1,
                "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId, int, std::less<S2BooleanOperation::SourceId>, std::allocator<std::pair<const S2BooleanOperation::SourceId, int>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<S2BooleanOperation::SourceId, int>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId, int, std::less<S2BooleanOperation::SourceId>, std::allocator<std::pair<const S2BooleanOperation::SourceId, int>>, 256, false>> *>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId, int, std::less<S2BooleanOperation::SourceId>, std::allocator<std::pair<const S2BooleanOperation::SourceId, int>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<S2BooleanOperation::SourceId, int>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId, int, std::less<S2BooleanOperation::SourceId>, std::allocator<std::pair<const S2BooleanOperation::SourceId, int>>, 256, false>> *>, SizeSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
               );
}

Assistant:

void btree_node<P>::split(const int insert_position, btree_node *dest,
                          allocator_type *alloc) {
  assert(dest->count() == 0);
  assert(max_count() == kNodeValues);

  // We bias the split based on the position being inserted. If we're
  // inserting at the beginning of the left node then bias the split to put
  // more values on the right node. If we're inserting at the end of the
  // right node then bias the split to put more values on the left node.
  if (insert_position == 0) {
    dest->set_count(count() - 1);
  } else if (insert_position == kNodeValues) {
    dest->set_count(0);
  } else {
    dest->set_count(count() / 2);
  }
  set_count(count() - dest->count());
  assert(count() >= 1);

  // Move values from the left sibling to the right sibling.
  uninitialized_move_n(dest->count(), count(), 0, dest, alloc);

  // Destroy the now-empty entries in the left node.
  value_destroy_n(count(), dest->count(), alloc);

  // The split key is the largest value in the left sibling.
  set_count(count() - 1);
  parent()->emplace_value(position(), alloc, slot(count()));
  value_destroy(count(), alloc);
  parent()->init_child(position() + 1, dest);

  if (!leaf()) {
    for (int i = 0; i <= dest->count(); ++i) {
      assert(child(count() + i + 1) != nullptr);
      dest->init_child(i, child(count() + i + 1));
      clear_child(count() + i + 1);
    }
  }
}